

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::Visibility> *this,double t)

{
  Sample local_20;
  
  local_20.blocked = true;
  local_20.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>>
              *)this,&local_20);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }